

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

void CheckLINK(TidyDocImpl *doc,Node *node)

{
  AttVal *pAVar1;
  AttVal *pAVar2;
  AttVal *pAVar3;
  
  pAVar1 = prvTidyAttrGetById(node,TidyAttr_HREF);
  pAVar2 = prvTidyAttrGetById(node,TidyAttr_REL);
  pAVar3 = prvTidyAttrGetById(node,TidyAttr_ITEMPROP);
  if (pAVar1 == (AttVal *)0x0) {
    prvTidyReportMissingAttr(doc,node,"href");
  }
  if (pAVar3 != (AttVal *)0x0 || pAVar2 != (AttVal *)0x0) {
    return;
  }
  prvTidyReportMissingAttr(doc,node,"rel");
  return;
}

Assistant:

void CheckLINK( TidyDocImpl* doc, Node *node )
{
    Bool HasHref = TY_(AttrGetById)(node, TidyAttr_HREF) != NULL;
    Bool HasRel = TY_(AttrGetById)(node, TidyAttr_REL) != NULL;
    Bool HasItemprop = TY_(AttrGetById)(node, TidyAttr_ITEMPROP) != NULL;

    if (!HasHref)
    {
      TY_(ReportMissingAttr)( doc, node, "href" );
    }

    if (!HasItemprop && !HasRel)
    {
      TY_(ReportMissingAttr)( doc, node, "rel" );
    }
}